

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

int xmlRelaxNGRegisterTypeLibrary
              (xmlChar *namespace,void *data,xmlRelaxNGTypeHave have,xmlRelaxNGTypeCheck check,
              xmlRelaxNGTypeCompare comp,xmlRelaxNGFacetCheck facet,xmlRelaxNGTypeFree freef)

{
  xmlGenericErrorFunc UNRECOVERED_JUMPTABLE;
  undefined4 in_EAX;
  int iVar1;
  int extraout_EAX;
  void *pvVar2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  undefined8 *userdata;
  xmlChar *pxVar5;
  undefined1 auVar6 [16];
  
  auVar6._0_4_ = -(uint)(namespace == (xmlChar *)0x0);
  auVar6._4_4_ = -(uint)(xmlRelaxNGRegisteredTypes == (xmlHashTablePtr)0x0);
  auVar6._8_4_ = -(uint)(have == (xmlRelaxNGTypeHave)0x0);
  auVar6._12_4_ = -(uint)(check == (xmlRelaxNGTypeCheck)0x0);
  iVar1 = movmskps(in_EAX,auVar6);
  if (iVar1 == 0) {
    pvVar2 = xmlHashLookup(xmlRelaxNGRegisteredTypes,namespace);
    if (pvVar2 != (void *)0x0) {
      pp_Var3 = __xmlGenericError();
      UNRECOVERED_JUMPTABLE = *pp_Var3;
      ppvVar4 = __xmlGenericErrorContext();
      iVar1 = (*UNRECOVERED_JUMPTABLE)
                        (*ppvVar4,"Relax-NG types library \'%s\' already registered\n",namespace,
                         UNRECOVERED_JUMPTABLE);
      return iVar1;
    }
    userdata = (undefined8 *)(*xmlMalloc)(0x38);
    if (userdata == (undefined8 *)0x0) {
      xmlRngVErrMemory((xmlRelaxNGValidCtxtPtr)0x0,"adding types library\n");
      return extraout_EAX;
    }
    userdata[4] = 0;
    userdata[5] = 0;
    userdata[2] = 0;
    userdata[3] = 0;
    *userdata = 0;
    userdata[1] = 0;
    userdata[6] = 0;
    pxVar5 = xmlStrdup(namespace);
    *userdata = pxVar5;
    userdata[1] = 0;
    userdata[2] = data;
    userdata[4] = check;
    userdata[3] = have;
    userdata[5] = comp;
    userdata[6] = facet;
    iVar1 = xmlHashAddEntry(xmlRelaxNGRegisteredTypes,namespace,userdata);
    if (iVar1 < 0) {
      pp_Var3 = __xmlGenericError();
      UNRECOVERED_JUMPTABLE = *pp_Var3;
      ppvVar4 = __xmlGenericErrorContext();
      (*UNRECOVERED_JUMPTABLE)
                (*ppvVar4,"Relax-NG types library failed to register \'%s\'\n",namespace);
      if ((void *)*userdata != (void *)0x0) {
        (*xmlFree)((void *)*userdata);
      }
      iVar1 = (*xmlFree)(userdata);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

static int
xmlRelaxNGRegisterTypeLibrary(const xmlChar * namespace, void *data,
                              xmlRelaxNGTypeHave have,
                              xmlRelaxNGTypeCheck check,
                              xmlRelaxNGTypeCompare comp,
                              xmlRelaxNGFacetCheck facet,
                              xmlRelaxNGTypeFree freef)
{
    xmlRelaxNGTypeLibraryPtr lib;
    int ret;

    if ((xmlRelaxNGRegisteredTypes == NULL) || (namespace == NULL) ||
        (check == NULL) || (comp == NULL))
        return (-1);
    if (xmlHashLookup(xmlRelaxNGRegisteredTypes, namespace) != NULL) {
        xmlGenericError(xmlGenericErrorContext,
                        "Relax-NG types library '%s' already registered\n",
                        namespace);
        return (-1);
    }
    lib =
        (xmlRelaxNGTypeLibraryPtr)
        xmlMalloc(sizeof(xmlRelaxNGTypeLibrary));
    if (lib == NULL) {
        xmlRngVErrMemory(NULL, "adding types library\n");
        return (-1);
    }
    memset(lib, 0, sizeof(xmlRelaxNGTypeLibrary));
    lib->namespace = xmlStrdup(namespace);
    lib->data = data;
    lib->have = have;
    lib->comp = comp;
    lib->check = check;
    lib->facet = facet;
    lib->freef = freef;
    ret = xmlHashAddEntry(xmlRelaxNGRegisteredTypes, namespace, lib);
    if (ret < 0) {
        xmlGenericError(xmlGenericErrorContext,
                        "Relax-NG types library failed to register '%s'\n",
                        namespace);
        xmlRelaxNGFreeTypeLibrary(lib, namespace);
        return (-1);
    }
    return (0);
}